

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O0

void __thiscall FS::Focuser::doCaps(Focuser *this,CommandPacket cp)

{
  type sink;
  type pNVar1;
  NetInterface *pNVar2;
  char *string;
  DebugInterface *log;
  Focuser *this_local;
  CommandPacket cp_local;
  
  sink = std::unique_ptr<DebugInterface,_std::default_delete<DebugInterface>_>::operator*
                   (&this->debugLog);
  ::operator<<(sink,"Processing capabilities request\n");
  pNVar1 = std::unique_ptr<NetInterface,_std::default_delete<NetInterface>_>::operator*(&this->net);
  pNVar2 = ::operator<<(pNVar1,"MaxPos: ");
  pNVar2 = ::operator<<(pNVar2,(this->buildParams).maxAbsPos);
  ::operator<<(pNVar2,"\n");
  pNVar1 = std::unique_ptr<NetInterface,_std::default_delete<NetInterface>_>::operator*(&this->net);
  pNVar2 = ::operator<<(pNVar1,"CanHome: ");
  string = "NO\n";
  if (((this->buildParams).focuserHasHome & 1U) != 0) {
    string = "YES\n";
  }
  ::operator<<(pNVar2,string);
  return;
}

Assistant:

void Focuser::doCaps( CommandParser::CommandPacket cp )
{
  (void) cp;
  DebugInterface& log = *debugLog;

  log << "Processing capabilities request\n";
  *net << "MaxPos: " << buildParams.maxAbsPos << "\n";
  *net << "CanHome: " << (buildParams.focuserHasHome ? "YES\n" : "NO\n" );
}